

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::correctDual(HModel *this,int *freeInfeasCount)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  pointer pdVar5;
  int iVar6;
  int i;
  long lVar7;
  double dVar8;
  
  dVar1 = this->dblOption[2];
  lVar7 = 0;
  iVar6 = 0;
  do {
    if (this->numTot <= lVar7) {
      *freeInfeasCount = iVar6;
      return;
    }
    if ((this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] != 0) {
      dVar8 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7];
      if ((dVar8 != -1e+200) || (NAN(dVar8))) {
        pdVar5 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        pdVar5 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar2 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        if ((dVar2 == 1e+200) && (!NAN(dVar2))) {
          iVar6 = (iVar6 + 1) - (uint)(ABS(pdVar5[lVar7]) < dVar1);
          goto LAB_00132173;
        }
      }
      piVar4 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((double)piVar4[lVar7] * pdVar5[lVar7] <= -dVar1) {
        if (((dVar8 == -1e+200) && (!NAN(dVar8))) ||
           ((dVar8 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7], dVar8 == 1e+200 && (!NAN(dVar8))))) {
          this->problemPerturbed = 1;
          iVar3 = piVar4[lVar7];
          dVar8 = HRandom::dblRandom(&this->random);
          dVar8 = dVar8 + 1.0;
          if (iVar3 != 1) {
            dVar8 = -dVar8;
          }
          pdVar5 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pdVar5[lVar7];
          pdVar5[lVar7] = dVar8 * dVar1;
          pdVar5 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5[lVar7] = (dVar8 * dVar1 - dVar2) + pdVar5[lVar7];
        }
        else {
          flipBound(this,(int)lVar7);
        }
      }
    }
LAB_00132173:
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void HModel::correctDual(int *freeInfeasCount) {
  const double tau_d = dblOption[DBLOPT_DUAL_TOL];
  const double inf = HSOL_CONST_INF;
  int workCount = 0;
  for (int i = 0; i < numTot; i++) {
    if (nonbasicFlag[i]) {
      if (workLower[i] == -inf && workUpper[i] == inf) {
	// FREE variable
	workCount += (fabs(workDual[i]) >= tau_d);
      } else if (nonbasicMove[i] * workDual[i] <= -tau_d) {
	if (workLower[i] != -inf && workUpper[i] != inf) {
	  // Boxed variable = flip
	  flipBound(i);
	} else {
	  // Other variable = shift
	  problemPerturbed = 1;
	  if (nonbasicMove[i] == 1) {
	    double dual = (1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  } else {
	    double dual = -(1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  }
	}
      }
    }
  }
  
  *freeInfeasCount = workCount;
}